

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

void __thiscall
vkt::memory::anon_unknown_0::RenderIndexBuffer::prepare
          (RenderIndexBuffer *this,PrepareRenderPassContext *context)

{
  deUint64 dVar1;
  Context *pCVar2;
  DeviceInterface *deviceInterface;
  VkDevice device;
  ProgramCollection<vk::ProgramBinary> *pPVar3;
  PrepareRenderPassContext *pPVar4;
  RenderIndexBuffer *pRVar5;
  ProgramBinary *pPVar6;
  string local_d8;
  PrepareRenderPassContext *local_b0;
  RenderIndexBuffer *local_a8;
  VkRenderPass local_a0;
  string local_98;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_78;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_58;
  
  dVar1 = (context->m_renderPass).m_internal;
  pCVar2 = context->m_context->m_context;
  deviceInterface = pCVar2->m_vkd;
  device = pCVar2->m_device;
  pPVar3 = pCVar2->m_binaryCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"index-buffer.vert",(allocator<char> *)&local_98);
  pPVar6 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,&local_d8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&local_78,deviceInterface,device,pPVar6,0);
  local_58.m_data.deleter.m_device = local_78.m_data.deleter.m_device;
  local_58.m_data.deleter.m_allocator = local_78.m_data.deleter.m_allocator;
  local_58.m_data.object.m_internal = local_78.m_data.object.m_internal;
  local_58.m_data.deleter.m_deviceIface = local_78.m_data.deleter.m_deviceIface;
  local_78.m_data.object.m_internal = 0;
  local_78.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_78.m_data.deleter.m_device = (VkDevice)0x0;
  local_78.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_78);
  std::__cxx11::string::~string((string *)&local_d8);
  pPVar3 = context->m_context->m_context->m_binaryCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"render-white.frag",(allocator<char> *)&stack0xffffffffffffff08);
  local_b0 = context;
  local_a8 = this;
  local_a0.m_internal = dVar1;
  pPVar6 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar3,&local_98);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&local_d8,deviceInterface,device,pPVar6,0);
  local_78.m_data.deleter.m_device = (VkDevice)local_d8.field_2._M_allocated_capacity;
  local_78.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_d8.field_2._8_8_;
  local_78.m_data.object.m_internal = (deUint64)local_d8._M_dataplus._M_p;
  local_78.m_data.deleter.m_deviceIface = (DeviceInterface *)local_d8._M_string_length;
  local_d8._M_dataplus._M_p = (pointer)0x0;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_allocated_capacity = 0;
  local_d8.field_2._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&local_d8);
  std::__cxx11::string::~string((string *)&local_98);
  pRVar5 = local_a8;
  pPVar4 = local_b0;
  local_d8._M_dataplus._M_p = (pointer)0x0;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_allocated_capacity = 0;
  local_98._M_dataplus._M_p = (pointer)0x0;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  createPipelineWithResources
            (deviceInterface,device,local_a0,(deUint32)&local_58,(VkShaderModule *)&local_78,
             (VkShaderModule *)(ulong)(uint)local_b0->m_targetWidth,local_b0->m_targetHeight,
             (deUint32)&local_d8,
             (vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
              *)&local_98,
             (vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
              *)&stack0xffffffffffffff08,
             (vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
              *)0x0,VK_PRIMITIVE_TOPOLOGY_POINT_LIST,0,(VkPushConstantRange *)&local_a8->m_resources
             ,(PipelineResources *)0x0);
  std::
  _Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ::~_Vector_base((_Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                   *)&stack0xffffffffffffff08);
  std::
  _Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ::~_Vector_base((_Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
                   *)&local_98);
  std::
  _Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
  ::~_Vector_base((_Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
                   *)&local_d8);
  pRVar5->m_bufferSize = pPVar4->m_context->m_currentBufferSize;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_78);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_58);
  return;
}

Assistant:

void RenderIndexBuffer::prepare (PrepareRenderPassContext& context)
{
	const vk::DeviceInterface&				vkd						= context.getContext().getDeviceInterface();
	const vk::VkDevice						device					= context.getContext().getDevice();
	const vk::VkRenderPass					renderPass				= context.getRenderPass();
	const deUint32							subpass					= 0;
	const vk::Unique<vk::VkShaderModule>	vertexShaderModule		(vk::createShaderModule(vkd, device, context.getBinaryCollection().get("index-buffer.vert"), 0));
	const vk::Unique<vk::VkShaderModule>	fragmentShaderModule	(vk::createShaderModule(vkd, device, context.getBinaryCollection().get("render-white.frag"), 0));

	createPipelineWithResources(vkd, device, renderPass, subpass, *vertexShaderModule, *fragmentShaderModule, context.getTargetWidth(), context.getTargetHeight(),
								vector<vk::VkVertexInputBindingDescription>(), vector<vk::VkVertexInputAttributeDescription>(), vector<vk::VkDescriptorSetLayoutBinding>(), vk::VK_PRIMITIVE_TOPOLOGY_POINT_LIST, 0u, DE_NULL, m_resources);
	m_bufferSize = context.getBufferSize();
}